

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_6,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int row;
  long lVar2;
  float fVar3;
  float afStack_88 [2];
  Mat2x3 m_1;
  float afStack_68 [2];
  Mat2x3 m;
  float afStack_48 [2];
  Matrix<float,_3,_2> retVal;
  float local_28 [2];
  Vector<float,_3> res;
  float local_10 [4];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      fVar3 = 1.0;
      if (lVar2 != 0) {
        fVar3 = 0.0;
      }
      m.m_data.m_data[0].m_data[lVar2 + -2] = fVar3;
      fVar3 = 1.0;
      if (lVar2 != 1) {
        fVar3 = 0.0;
      }
      m.m_data.m_data[0].m_data[lVar2 + 1] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    m.m_data.m_data[0].m_data[1] = evalCtx->in[1].m_data[0];
    m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[2];
    m.m_data.m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    m.m_data.m_data[0].m_data[0] = 0.0;
    m.m_data.m_data[0].m_data[1] = 0.0;
    m.m_data.m_data[0].m_data[2] = 0.0;
    m.m_data.m_data[1].m_data[0] = 0.0;
    lVar2 = 0;
    do {
      fVar3 = (float)(&DAT_00af09d4)[lVar2 * 2];
      m.m_data.m_data[0].m_data[lVar2 + -2] =
           (float)(&sr::(anonymous_namespace)::s_constInMat2x3)[lVar2 * 2];
      m.m_data.m_data[0].m_data[lVar2 + 1] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      fVar3 = 1.0;
      if (lVar2 != 0) {
        fVar3 = 0.0;
      }
      m_1.m_data.m_data[0].m_data[lVar2 + -2] = fVar3;
      fVar3 = 1.0;
      if (lVar2 != 1) {
        fVar3 = 0.0;
      }
      m_1.m_data.m_data[0].m_data[lVar2 + 1] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    m_1.m_data.m_data[0].m_data[1] = evalCtx->in[1].m_data[0];
    m_1.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[2];
    m_1.m_data.m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    m_1.m_data.m_data[0].m_data[0] = 0.0;
    m_1.m_data.m_data[0].m_data[1] = 0.0;
    m_1.m_data.m_data[0].m_data[2] = 0.0;
    m_1.m_data.m_data[1].m_data[0] = 0.0;
    lVar2 = 0;
    do {
      fVar3 = (float)(&DAT_00af09ec)[lVar2 * 2];
      m_1.m_data.m_data[0].m_data[lVar2 + -2] = (float)(&DAT_00af09e8)[lVar2 * 2];
      m_1.m_data.m_data[0].m_data[lVar2 + 1] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  lVar2 = 0;
  do {
    fVar3 = 1.0;
    if (lVar2 != 0) {
      fVar3 = 0.0;
    }
    retVal.m_data.m_data[0].m_data[lVar2 + -2] = fVar3;
    fVar3 = 1.0;
    if (lVar2 != 1) {
      fVar3 = 0.0;
    }
    retVal.m_data.m_data[0].m_data[lVar2 + 1] = fVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    fVar3 = m.m_data.m_data[0].m_data[lVar2 + 1];
    fVar1 = m_1.m_data.m_data[0].m_data[lVar2 + 1];
    retVal.m_data.m_data[0].m_data[lVar2 + -2] =
         m.m_data.m_data[0].m_data[lVar2 + -2] * m_1.m_data.m_data[0].m_data[lVar2 + -2];
    retVal.m_data.m_data[0].m_data[lVar2 + 1] = fVar3 * fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res.m_data[0] = 0.0;
  lVar2 = 0;
  do {
    res.m_data[lVar2 + -2] =
         retVal.m_data.m_data[0].m_data[lVar2 + -2] + retVal.m_data.m_data[0].m_data[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)res.m_data[lVar2 + 2]] = retVal.m_data.m_data[1].m_data[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}